

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void anon_unknown.dwarf_1247fe5::processLinkDirectories
               (cmGeneratorTarget *tgt,EvaluatedTargetPropertyEntries *entries,
               vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *directories,
               unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *uniqueDirectories,bool debugDirectories)

{
  MessageType t;
  bool bVar1;
  PolicyStatus PVar2;
  reference pEVar3;
  reference in_name;
  ostream *poVar4;
  ulong uVar5;
  cmLocalGenerator *pcVar6;
  cmake *this;
  string *psVar7;
  PolicyID id;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar8;
  allocator<char> local_359;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_298;
  undefined1 local_290;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_288;
  undefined1 local_280;
  int local_274;
  string local_270;
  string local_250;
  MessageType local_230;
  byte local_229;
  MessageType messageType;
  bool noMessage;
  ostringstream e;
  string *entryDirectory;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string usedDirectories;
  string *targetName;
  cmLinkImplItem *item;
  EvaluatedTargetPropertyEntry *entry;
  iterator __end1;
  iterator __begin1;
  vector<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
  *__range1;
  bool debugDirectories_local;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *uniqueDirectories_local;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *directories_local;
  EvaluatedTargetPropertyEntries *entries_local;
  cmGeneratorTarget *tgt_local;
  
  __end1 = std::
           vector<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
           ::begin(&entries->Entries);
  entry = (EvaluatedTargetPropertyEntry *)
          std::
          vector<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
          ::end(&entries->Entries);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<(anonymous_namespace)::EvaluatedTargetPropertyEntry_*,_std::vector<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>_>
                                *)&entry);
    if (!bVar1) {
      return;
    }
    pEVar3 = __gnu_cxx::
             __normal_iterator<(anonymous_namespace)::EvaluatedTargetPropertyEntry_*,_std::vector<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>_>
             ::operator*(&__end1);
    usedDirectories.field_2._8_8_ =
         cmLinkItem::AsStr_abi_cxx11_(&pEVar3->LinkImplItem->super_cmLinkItem);
    std::__cxx11::string::string((string *)&__range2);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&pEVar3->Values);
    entryDirectory =
         (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&pEVar3->Values);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&entryDirectory), bVar1) {
      in_name = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end2);
      bVar1 = cmsys::SystemTools::FileIsFullPath(in_name);
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&messageType);
        local_229 = 0;
        local_230 = FATAL_ERROR;
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          poVar4 = std::operator<<((ostream *)&messageType,"Target \"");
          poVar4 = std::operator<<(poVar4,(string *)usedDirectories.field_2._8_8_);
          poVar4 = std::operator<<(poVar4,
                                   "\" contains relative path in its INTERFACE_LINK_DIRECTORIES:\n  \""
                                  );
          poVar4 = std::operator<<(poVar4,(string *)in_name);
          std::operator<<(poVar4,"\"");
        }
        else {
          PVar2 = cmGeneratorTarget::GetPolicyStatusCMP0081(tgt);
          if (PVar2 == OLD) {
            local_229 = 1;
          }
          else if (PVar2 == WARN) {
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_250,(cmPolicies *)0x51,id);
            poVar4 = std::operator<<((ostream *)&messageType,(string *)&local_250);
            std::operator<<(poVar4,"\n");
            std::__cxx11::string::~string((string *)&local_250);
            local_230 = AUTHOR_WARNING;
          }
          poVar4 = std::operator<<((ostream *)&messageType,
                                   "Found relative path while evaluating link directories of \"");
          psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
          poVar4 = std::operator<<(poVar4,(string *)psVar7);
          poVar4 = std::operator<<(poVar4,"\":\n  \"");
          poVar4 = std::operator<<(poVar4,(string *)in_name);
          std::operator<<(poVar4,"\"\n");
        }
        if ((local_229 & 1) == 0) {
          pcVar6 = cmGeneratorTarget::GetLocalGenerator(tgt);
          t = local_230;
          std::__cxx11::ostringstream::str();
          cmLocalGenerator::IssueMessage(pcVar6,t,&local_270);
          std::__cxx11::string::~string((string *)&local_270);
          if (local_230 != FATAL_ERROR) goto LAB_00823811;
          local_274 = 1;
        }
        else {
LAB_00823811:
          local_274 = 0;
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&messageType);
        if (local_274 != 0) goto LAB_00823b62;
      }
      cmsys::SystemTools::ConvertToUnixSlashes(in_name);
      pVar8 = std::
              unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::insert(uniqueDirectories,in_name);
      local_298._M_cur =
           (__node_type *)
           pVar8.first.
           super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ._M_cur;
      local_290 = pVar8.second;
      local_288._M_cur = local_298._M_cur;
      local_280 = local_290;
      if ((((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
         (std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<std::__cxx11::string&,cmListFileBacktrace&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     directories,in_name,&pEVar3->Backtrace), debugDirectories)) {
        std::operator+(&local_2d8," * ",in_name);
        std::operator+(&local_2b8,&local_2d8,"\n");
        std::__cxx11::string::operator+=((string *)&__range2,(string *)&local_2b8);
        std::__cxx11::string::~string((string *)&local_2b8);
        std::__cxx11::string::~string((string *)&local_2d8);
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      pcVar6 = cmGeneratorTarget::GetLocalGenerator(tgt);
      this = cmLocalGenerator::GetCMakeInstance(pcVar6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_358,"Used link directories for target ",&local_359);
      psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
      std::operator+(&local_338,&local_358,psVar7);
      std::operator+(&local_318,&local_338,":\n");
      std::operator+(&local_2f8,&local_318,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range2)
      ;
      cmake::IssueMessage(this,LOG,&local_2f8,&pEVar3->Backtrace);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_318);
      std::__cxx11::string::~string((string *)&local_338);
      std::__cxx11::string::~string((string *)&local_358);
      std::allocator<char>::~allocator(&local_359);
    }
    local_274 = 0;
LAB_00823b62:
    std::__cxx11::string::~string((string *)&__range2);
    if (local_274 != 0) {
      return;
    }
    __gnu_cxx::
    __normal_iterator<(anonymous_namespace)::EvaluatedTargetPropertyEntry_*,_std::vector<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void processLinkDirectories(cmGeneratorTarget const* tgt,
                            EvaluatedTargetPropertyEntries& entries,
                            std::vector<BT<std::string>>& directories,
                            std::unordered_set<std::string>& uniqueDirectories,
                            bool debugDirectories)
{
  for (EvaluatedTargetPropertyEntry& entry : entries.Entries) {
    cmLinkImplItem const& item = entry.LinkImplItem;
    std::string const& targetName = item.AsStr();

    std::string usedDirectories;
    for (std::string& entryDirectory : entry.Values) {
      if (!cmSystemTools::FileIsFullPath(entryDirectory)) {
        std::ostringstream e;
        bool noMessage = false;
        MessageType messageType = MessageType::FATAL_ERROR;
        if (!targetName.empty()) {
          /* clang-format off */
          e << "Target \"" << targetName << "\" contains relative "
            "path in its INTERFACE_LINK_DIRECTORIES:\n"
            "  \"" << entryDirectory << "\"";
          /* clang-format on */
        } else {
          switch (tgt->GetPolicyStatusCMP0081()) {
            case cmPolicies::WARN: {
              e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0081) << "\n";
              messageType = MessageType::AUTHOR_WARNING;
            } break;
            case cmPolicies::OLD:
              noMessage = true;
              break;
            case cmPolicies::REQUIRED_IF_USED:
            case cmPolicies::REQUIRED_ALWAYS:
            case cmPolicies::NEW:
              // Issue the fatal message.
              break;
          }
          e << "Found relative path while evaluating link directories of "
               "\""
            << tgt->GetName() << "\":\n  \"" << entryDirectory << "\"\n";
        }
        if (!noMessage) {
          tgt->GetLocalGenerator()->IssueMessage(messageType, e.str());
          if (messageType == MessageType::FATAL_ERROR) {
            return;
          }
        }
      }

      // Sanitize the path the same way the link_directories command does
      // in case projects set the LINK_DIRECTORIES property directly.
      cmSystemTools::ConvertToUnixSlashes(entryDirectory);
      if (uniqueDirectories.insert(entryDirectory).second) {
        directories.emplace_back(entryDirectory, entry.Backtrace);
        if (debugDirectories) {
          usedDirectories += " * " + entryDirectory + "\n";
        }
      }
    }
    if (!usedDirectories.empty()) {
      tgt->GetLocalGenerator()->GetCMakeInstance()->IssueMessage(
        MessageType::LOG,
        std::string("Used link directories for target ") + tgt->GetName() +
          ":\n" + usedDirectories,
        entry.Backtrace);
    }
  }
}